

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateWrapperFieldGetterDocComment
               (Printer *printer,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Descriptor *this;
  FieldDescriptor *this_00;
  undefined1 is_descriptor;
  string local_88;
  string local_68;
  undefined1 local_48 [32];
  
  is_descriptor = SUB81(&local_88,0);
  this = FieldDescriptor::message_type(field);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"value","");
  this_00 = Descriptor::FindFieldByName(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  io::Printer::Print<>(printer,"/**\n");
  UnderscoresToCamelCase(&local_88,*(string **)field,true);
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer," * Returns the unboxed value from <code>get^camel_name^()</code>\n\n",
             (char (*) [11])"camel_name",&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  FieldDescriptor::DebugString_abi_cxx11_((string *)local_48,field);
  FirstLineOf(&local_68,(php *)local_48._0_8_,(string *)local_48._8_8_);
  EscapePhpdoc(&local_88,&local_68);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer," * Generated from protobuf field <code>^def^</code>\n",(char (*) [4])0x398bf6,
             &local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((php *)local_48._0_8_ != (php *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  PhpGetterTypeName_abi_cxx11_(&local_88,(php *)this_00,(FieldDescriptor *)0x0,(bool)is_descriptor);
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer," * @return ^php_type^|null\n",(char (*) [9])"php_type",&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  io::Printer::Print<>(printer," */\n");
  return;
}

Assistant:

void GenerateWrapperFieldGetterDocComment(io::Printer* printer, const FieldDescriptor* field) {
  // Generate a doc comment for the special getXXXValue methods that are
  // generated for wrapper types.
  const FieldDescriptor* primitiveField = field->message_type()->FindFieldByName("value");
  printer->Print("/**\n");
  printer->Print(
      " * Returns the unboxed value from <code>get^camel_name^()</code>\n\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  GenerateDocCommentBody(printer, field);
  printer->Print(
    " * Generated from protobuf field <code>^def^</code>\n",
    "def", EscapePhpdoc(FirstLineOf(field->DebugString())));
  printer->Print(" * @return ^php_type^|null\n",
        "php_type", PhpGetterTypeName(primitiveField, false));
  printer->Print(" */\n");
}